

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O3

Vector3f __thiscall blinnPhong::sample(blinnPhong *this,Ray *ray,Hit *h)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  long in_RCX;
  Vector3f *rv;
  Vector3f *pVVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  undefined8 uVar10;
  undefined8 extraout_XMM0_Qa;
  Vector3f VVar11;
  Vector3f y;
  Vector3f x;
  Vector3f normal;
  default_random_engine generator;
  Vector3f spec;
  Vector3f diff;
  float local_108;
  float local_104;
  float local_f4;
  Vector3f local_f0;
  float local_e4;
  Vector3f *local_e0;
  Vector3f local_d4;
  Vector3f *local_c8;
  Vector3f local_bc;
  double local_b0;
  Vector3f local_a4;
  Vector3f local_98;
  Vector3f local_8c;
  Vector3f local_80;
  Vector3f local_74;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_68;
  Vector3f local_60;
  Vector3f local_54;
  Vector3f local_48;
  Vector3f local_3c;
  undefined4 extraout_XMM0_Db;
  
  local_b0 = (double)CONCAT44(local_b0._4_4_,(*(Vector3f **)(in_RCX + 8))[4].m_elements[0]);
  Vector3f::Vector3f(&local_3c,*(Vector3f **)(in_RCX + 8));
  Vector3f::Vector3f(&local_48,(Vector3f *)(*(long *)(in_RCX + 8) + 0xc));
  pfVar4 = Vector3f::operator[](&local_3c,0);
  fVar6 = *pfVar4;
  pfVar4 = Vector3f::operator[](&local_3c,1);
  fVar7 = *pfVar4;
  pfVar4 = Vector3f::operator[](&local_3c,2);
  fVar8 = *pfVar4;
  pfVar4 = Vector3f::operator[](&local_48,0);
  fVar1 = *pfVar4;
  pfVar4 = Vector3f::operator[](&local_48,1);
  fVar2 = *pfVar4;
  pfVar4 = Vector3f::operator[](&local_48,2);
  local_e0 = (Vector3f *)
             CONCAT44(local_e0._4_4_,
                      1.0 / ((fVar6 + fVar7 + fVar8) / (fVar1 + fVar2 + *pfVar4) + 1.0));
  iVar3 = rand();
  local_68._M_x = (ulong)(long)iVar3 % 0x7fffffff + (ulong)((ulong)(long)iVar3 % 0x7fffffff == 0);
  local_108 = std::
              generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                        (&local_68);
  local_108 = local_108 + 0.0;
  fVar6 = std::
          generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (&local_68);
  local_f4 = (fVar6 + 0.0) * 6.2831855;
  dVar9 = sin((double)local_f4);
  local_104 = (float)dVar9;
  dVar9 = cos((double)local_f4);
  fVar6 = (float)dVar9;
  Vector3f::Vector3f(&local_8c,0.0);
  Vector3f::Vector3f(&local_98,0.0);
  Vector3f::Vector3f(&local_a4,0.0);
  pVVar5 = (Vector3f *)(in_RCX + 0x10);
  Vector3f::Vector3f(&local_f0,pVVar5);
  local_c8 = (Vector3f *)this;
  operator-(&local_f0);
  fVar7 = std::
          generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (&local_68);
  if (fVar7 <= local_e0._0_4_) {
    rv = (Vector3f *)((long)&h->material + 4);
    Vector3f::Vector3f(&local_bc,rv);
    Vector3f::Vector3f(&local_74,rv);
    Vector3f::Vector3f(&local_80,pVVar5);
    local_e4 = Vector3f::dot(&local_74,&local_80);
    local_e4 = local_e4 + local_e4;
    local_e0 = pVVar5;
    Vector3f::Vector3f(&local_54,pVVar5);
    ::operator*(local_e4,&local_60);
    operator-(&local_bc,&local_60);
    Vector3f::normalized(&local_d4);
    Vector3f::operator=(&local_8c,&local_f0);
    Vector3f::Vector3f(&local_bc,1.0,2.0,3.0);
    Vector3f::cross(&local_bc,&local_8c);
    Vector3f::normalized(&local_d4);
    Vector3f::operator=(&local_98,&local_f0);
    Vector3f::cross(&local_98,&local_8c);
    Vector3f::normalized(&local_d4);
    Vector3f::operator=(&local_a4,&local_f0);
    local_b0 = (double)(1.0 / (local_b0._0_4_ + 1.0));
    iVar3 = 10;
    do {
      dVar9 = pow((double)local_108,local_b0);
      fVar7 = (float)dVar9;
      fVar8 = 1.0 - fVar7 * fVar7;
      if (fVar8 < 0.0) {
        local_e4 = fVar7;
        fVar8 = sqrtf(fVar8);
        fVar7 = local_e4;
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      ::operator*(fVar7,&local_d4);
      ::operator*(local_104,&local_74);
      ::operator*(fVar6,&local_80);
      operator+(&local_74,&local_80);
      ::operator*(fVar8,&local_bc);
      operator+(&local_d4,&local_bc);
      pVVar5 = local_c8;
      Vector3f::operator=(local_c8,&local_f0);
      Vector3f::Vector3f(&local_f0,local_e0);
      fVar6 = Vector3f::dot(pVVar5,&local_f0);
      uVar10 = CONCAT44(extraout_XMM0_Db,fVar6);
      fVar7 = 0.0;
      if (0.0 < fVar6) goto LAB_0012a1b9;
      local_108 = std::
                  generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (&local_68);
      local_108 = local_108 + 0.0;
      dVar9 = fmod((double)local_f4 + 0.4,6.283185307179586);
      local_f4 = (float)dVar9;
      dVar9 = sin((double)local_f4);
      local_104 = (float)dVar9;
      dVar9 = cos((double)local_f4);
      fVar6 = (float)dVar9;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    if (local_108 < 0.0) {
      local_f4 = sqrtf(local_108);
    }
    else {
      local_f4 = SQRT(local_108);
    }
    pVVar5 = local_e0;
    local_108 = 1.0 - local_f4 * local_f4;
    if (local_108 < 0.0) {
      local_108 = sqrtf(local_108);
    }
    else {
      local_108 = SQRT(local_108);
    }
  }
  else {
    if (local_108 < 0.0) {
      local_f4 = sqrtf(local_108);
    }
    else {
      local_f4 = SQRT(local_108);
    }
    local_108 = 1.0 - local_f4 * local_f4;
    if (local_108 < 0.0) {
      local_108 = sqrtf(local_108);
    }
    else {
      local_108 = SQRT(local_108);
    }
  }
  Vector3f::Vector3f(&local_f0,pVVar5);
  Vector3f::operator=(&local_8c,&local_f0);
  Vector3f::Vector3f(&local_bc,1.0,2.0,3.0);
  Vector3f::cross(&local_bc,&local_8c);
  Vector3f::normalized(&local_d4);
  Vector3f::operator=(&local_98,&local_f0);
  Vector3f::cross(&local_98,&local_8c);
  Vector3f::normalized(&local_d4);
  Vector3f::operator=(&local_a4,&local_f0);
  ::operator*(local_f4,&local_d4);
  ::operator*(local_104,&local_74);
  ::operator*(fVar6,&local_80);
  operator+(&local_74,&local_80);
  ::operator*(local_108,&local_bc);
  VVar11 = operator+(&local_d4,&local_bc);
  fVar7 = VVar11.m_elements[2];
  Vector3f::operator=(local_c8,&local_f0);
  uVar10 = extraout_XMM0_Qa;
LAB_0012a1b9:
  VVar11.m_elements[2] = fVar7;
  VVar11.m_elements[0] = (float)(int)uVar10;
  VVar11.m_elements[1] = (float)(int)((ulong)uVar10 >> 0x20);
  return (Vector3f)VVar11.m_elements;
}

Assistant:

Vector3f blinnPhong::sample(const Ray &ray, Hit &h) const {
    float shininess = h.getMaterial()->getShininess();
    Vector3f diff = h.getMaterial()->getDiffuseColor();
    Vector3f spec = h.getMaterial()->getSpecularColor();
    float prob_spec = 1.f / (1.f + (diff[0] + diff[1] + diff[2]) / (spec[0] + spec[1] + spec[2]));
    int max_iters = 10;

    std::default_random_engine generator(rand());
    std::uniform_real_distribution<float> uniform(0.f, 1.f);

    float u = uniform(generator);
    float v = 2.f * (float)M_PI * uniform(generator);
    float sin_v = sin(v);
    float cos_v = cos(v);

    float r;
    float factor;
    Vector3f normal;
    Vector3f x;
    Vector3f y;
    Vector3f output = -h.getNormal();

    if (uniform(generator) > prob_spec) {
        // do diffuse distribution
        r = sqrt(u);
        factor = sqrt(1-r*r);
        normal = h.getNormal();

        x = Vector3f::cross(Vector3f(1., 2., 3.), normal).normalized();
        y = Vector3f::cross(x, normal).normalized();
        output = r * normal + factor * (sin_v * x + cos_v * y);
    } else {
        // do specular distribution
        normal = (ray.getDirection() -
                  2 * Vector3f::dot(ray.getDirection(), h.getNormal()) * h.getNormal()).normalized();
        x = Vector3f::cross(Vector3f(1., 2., 3.), normal).normalized();
        y = Vector3f::cross(x, normal).normalized();

        for (int i=0; i<max_iters; i++) {
            r = pow(u, 1.f / (1.f + shininess));
            factor = sqrt(1 - r * r);
            output = r * normal + factor * (sin_v * x + cos_v * y);

            if (Vector3f::dot(output, h.getNormal()) > 0) {
                return output;
            }

            u = uniform(generator);
            v = fmod(v + 0.4, 2 * M_PI);
            sin_v = sin(v); cos_v = cos(v);
        }

        r = sqrt(u);
        factor = sqrt(1-r*r);
        normal = h.getNormal();
        x = Vector3f::cross(Vector3f(1., 2., 3.), normal).normalized();
        y = Vector3f::cross(x, normal).normalized();
        output = r * normal + factor * (sin_v * x + cos_v * y);
    }

    return output;
}